

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

void __thiscall Cache::initCache(Cache *this)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pBVar5;
  allocator_type local_69;
  vector<Cache::Block,_std::allocator<Cache::Block>_> local_68;
  vector<Cache::Block,_std::allocator<Cache::Block>_> local_48;
  
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::vector
            (&local_48,(ulong)(this->policy).blockNum,&local_69);
  local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector(&local_68);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector(&local_48);
  pBVar5 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar5) {
    uVar4 = 0;
    do {
      pBVar5[uVar4].valid = false;
      pBVar5[uVar4].modified = false;
      uVar1 = (this->policy).blockSize;
      pBVar5[uVar4].size = uVar1;
      pBVar5[uVar4].tag = 0;
      pBVar5[uVar4].id = (uint32_t)(uVar4 / (this->policy).associativity);
      pBVar5[uVar4].lastReference = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,(ulong)uVar1,
                 (allocator_type *)&local_48);
      puVar2 = pBVar5[uVar4].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar5[uVar4].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           &(local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start)->valid;
      pBVar5[uVar4].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           &(local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_finish)->valid;
      pBVar5[uVar4].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           &(local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage)->valid;
      local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
        if (local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      pBVar5 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar5 >> 4) *
              -0x5555555555555555;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  return;
}

Assistant:

void Cache::initCache() {
  this->blocks = std::vector<Block>(policy.blockNum);
  for (uint32_t i = 0; i < this->blocks.size(); ++i) {
    Block &b = this->blocks[i];
    b.valid = false;
    b.modified = false;
    b.size = policy.blockSize;
    b.tag = 0;
    b.id = i / policy.associativity;
    b.lastReference = 0;
    b.data = std::vector<uint8_t>(b.size);
  }
}